

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

PackageExportAllDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PackageExportAllDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,Token *args_5)

{
  Info *pIVar1;
  Info *pIVar2;
  size_type sVar3;
  pointer ppAVar4;
  Info *pIVar5;
  Info *pIVar6;
  Info *pIVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  TokenKind TVar18;
  undefined1 uVar19;
  NumericTokenFlags NVar20;
  uint32_t uVar21;
  TokenKind TVar22;
  undefined1 uVar23;
  NumericTokenFlags NVar24;
  uint32_t uVar25;
  TokenKind TVar26;
  undefined1 uVar27;
  NumericTokenFlags NVar28;
  uint32_t uVar29;
  PackageExportAllDeclarationSyntax *pPVar30;
  long lVar31;
  
  pPVar30 = (PackageExportAllDeclarationSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((PackageExportAllDeclarationSyntax *)this->endPtr < pPVar30 + 1) {
    pPVar30 = (PackageExportAllDeclarationSyntax *)allocateSlow(this,0x90,8);
  }
  else {
    this->head->current = (byte *)(pPVar30 + 1);
  }
  TVar10 = args_1->kind;
  uVar11 = args_1->field_0x2;
  NVar12.raw = (args_1->numFlags).raw;
  uVar13 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar14 = args_2->kind;
  uVar15 = args_2->field_0x2;
  NVar16.raw = (args_2->numFlags).raw;
  uVar17 = args_2->rawLen;
  pIVar2 = args_2->info;
  TVar18 = args_3->kind;
  uVar19 = args_3->field_0x2;
  NVar20.raw = (args_3->numFlags).raw;
  uVar21 = args_3->rawLen;
  pIVar5 = args_3->info;
  TVar22 = args_4->kind;
  uVar23 = args_4->field_0x2;
  NVar24.raw = (args_4->numFlags).raw;
  uVar25 = args_4->rawLen;
  pIVar6 = args_4->info;
  TVar26 = args_5->kind;
  uVar27 = args_5->field_0x2;
  NVar28.raw = (args_5->numFlags).raw;
  uVar29 = args_5->rawLen;
  pIVar7 = args_5->info;
  (pPVar30->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pPVar30->super_MemberSyntax).super_SyntaxNode.kind = PackageExportAllDeclaration;
  SVar8 = (args->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar9 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pPVar30->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pPVar30->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar8;
  *(undefined4 *)
   &(pPVar30->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar9
  ;
  (pPVar30->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00507f08;
  (pPVar30->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_SyntaxListBase).childCount;
  sVar3 = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).size_
  ;
  (pPVar30->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).data_;
  (pPVar30->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar3;
  (pPVar30->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00508348;
  (pPVar30->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pPVar30;
  sVar3 = (pPVar30->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar3 != 0) {
    ppAVar4 = (pPVar30->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar31 = 0;
    do {
      **(undefined8 **)((long)ppAVar4 + lVar31) = pPVar30;
      lVar31 = lVar31 + 8;
    } while (sVar3 << 3 != lVar31);
  }
  (pPVar30->keyword).kind = TVar10;
  (pPVar30->keyword).field_0x2 = uVar11;
  (pPVar30->keyword).numFlags = (NumericTokenFlags)NVar12.raw;
  (pPVar30->keyword).rawLen = uVar13;
  (pPVar30->keyword).info = pIVar1;
  (pPVar30->star1).kind = TVar14;
  (pPVar30->star1).field_0x2 = uVar15;
  (pPVar30->star1).numFlags = (NumericTokenFlags)NVar16.raw;
  (pPVar30->star1).rawLen = uVar17;
  (pPVar30->star1).info = pIVar2;
  (pPVar30->doubleColon).kind = TVar18;
  (pPVar30->doubleColon).field_0x2 = uVar19;
  (pPVar30->doubleColon).numFlags = (NumericTokenFlags)NVar20.raw;
  (pPVar30->doubleColon).rawLen = uVar21;
  (pPVar30->doubleColon).info = pIVar5;
  (pPVar30->star2).kind = TVar22;
  (pPVar30->star2).field_0x2 = uVar23;
  (pPVar30->star2).numFlags = (NumericTokenFlags)NVar24.raw;
  (pPVar30->star2).rawLen = uVar25;
  (pPVar30->star2).info = pIVar6;
  (pPVar30->semi).kind = TVar26;
  (pPVar30->semi).field_0x2 = uVar27;
  (pPVar30->semi).numFlags = (NumericTokenFlags)NVar28.raw;
  (pPVar30->semi).rawLen = uVar29;
  (pPVar30->semi).info = pIVar7;
  return pPVar30;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }